

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

SRes crnlib::LzmaEnc_CodeOneBlock
               (CLzmaEnc *p,Bool useLimits,UInt32 maxPackSize,UInt32 maxUnpackSize)

{
  UInt32 UVar1;
  SRes SVar2;
  uint uVar3;
  int iVar4;
  uint symbol;
  Byte *pBVar5;
  byte *pbVar6;
  uint local_8c;
  UInt32 processed;
  UInt32 posReduced;
  UInt32 base;
  UInt32 footerBits;
  UInt32 i;
  UInt32 posSlot;
  UInt32 distance;
  Byte *data;
  UInt16 *probs;
  UInt32 UStack_40;
  Byte curByte_1;
  UInt32 posState;
  UInt32 len;
  UInt32 pos;
  SRes SStack_30;
  Byte curByte;
  UInt32 numPairs;
  int __result__;
  UInt32 startPos32;
  UInt32 nowPos32;
  UInt32 maxUnpackSize_local;
  UInt32 maxPackSize_local;
  Bool useLimits_local;
  CLzmaEnc *p_local;
  
  startPos32 = maxUnpackSize;
  nowPos32 = maxPackSize;
  maxUnpackSize_local = useLimits;
  _maxPackSize_local = p;
  if (p->inStream != (ISeqInStream *)0x0) {
    (p->matchFinderBase).stream = p->inStream;
    (*(p->matchFinder).Init)(p->matchFinderObj);
    _maxPackSize_local->inStream = (ISeqInStream *)0x0;
  }
  if (_maxPackSize_local->finished == 0) {
    SStack_30 = CheckErrors(_maxPackSize_local);
    p_local._4_4_ = SStack_30;
    if (SStack_30 == 0) {
      numPairs = (UInt32)_maxPackSize_local->nowPos64;
      __result__ = numPairs;
      if (_maxPackSize_local->nowPos64 == 0) {
        UVar1 = (*(_maxPackSize_local->matchFinder).GetNumAvailableBytes)
                          (_maxPackSize_local->matchFinderObj);
        if (UVar1 == 0) {
          SVar2 = Flush(_maxPackSize_local,__result__);
          return SVar2;
        }
        ReadMatchDistances(_maxPackSize_local,&pos);
        RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                           _maxPackSize_local->isMatch[_maxPackSize_local->state],0);
        _maxPackSize_local->state =
             *(UInt32 *)(kLiteralNextStates + (ulong)_maxPackSize_local->state * 4);
        len._3_1_ = (*(_maxPackSize_local->matchFinder).GetIndexByte)
                              (_maxPackSize_local->matchFinderObj,
                               -_maxPackSize_local->additionalOffset);
        LitEnc_Encode(&_maxPackSize_local->rc,_maxPackSize_local->litProbs,(uint)len._3_1_);
        _maxPackSize_local->additionalOffset = _maxPackSize_local->additionalOffset - 1;
        __result__ = __result__ + 1;
      }
      UVar1 = (*(_maxPackSize_local->matchFinder).GetNumAvailableBytes)
                        (_maxPackSize_local->matchFinderObj);
      if (UVar1 == 0) {
LAB_0020ea88:
        _maxPackSize_local->nowPos64 = (ulong)(__result__ - numPairs) + _maxPackSize_local->nowPos64
        ;
        p_local._4_4_ = Flush(_maxPackSize_local,__result__);
      }
      else {
        do {
          while( true ) {
            do {
              if (_maxPackSize_local->fastMode == 0) {
                UStack_40 = GetOptimum(_maxPackSize_local,__result__,&posState);
              }
              else {
                UStack_40 = GetOptimumFast(_maxPackSize_local,&posState);
              }
              uVar3 = __result__ & _maxPackSize_local->pbMask;
              if ((UStack_40 == 1) && (posState == 0xffffffff)) {
                RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                   _maxPackSize_local->isMatch[_maxPackSize_local->state] + uVar3,0)
                ;
                pBVar5 = (*(_maxPackSize_local->matchFinder).GetPointerToCurrentPos)
                                   (_maxPackSize_local->matchFinderObj);
                pbVar6 = pBVar5 + -(ulong)_maxPackSize_local->additionalOffset;
                if (_maxPackSize_local->state < 7) {
                  LitEnc_Encode(&_maxPackSize_local->rc,
                                _maxPackSize_local->litProbs +
                                (((__result__ & _maxPackSize_local->lpMask) <<
                                 ((byte)_maxPackSize_local->lc & 0x1f)) +
                                ((int)(uint)pbVar6[-1] >> (8U - (char)_maxPackSize_local->lc & 0x1f)
                                )) * 0x300,(uint)*pbVar6);
                }
                else {
                  LitEnc_EncodeMatched
                            (&_maxPackSize_local->rc,
                             _maxPackSize_local->litProbs +
                             (((__result__ & _maxPackSize_local->lpMask) <<
                              ((byte)_maxPackSize_local->lc & 0x1f)) +
                             ((int)(uint)pbVar6[-1] >> (8U - (char)_maxPackSize_local->lc & 0x1f)))
                             * 0x300,(uint)*pbVar6,
                             (uint)pbVar6[-1 - (ulong)_maxPackSize_local->reps[0]]);
                }
                _maxPackSize_local->state =
                     *(UInt32 *)(kLiteralNextStates + (ulong)_maxPackSize_local->state * 4);
              }
              else {
                RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                   _maxPackSize_local->isMatch[_maxPackSize_local->state] + uVar3,1)
                ;
                if (posState < 4) {
                  RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                     _maxPackSize_local->isRep + _maxPackSize_local->state,1);
                  if (posState == 0) {
                    RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                       _maxPackSize_local->isRepG0 + _maxPackSize_local->state,0);
                    RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                       _maxPackSize_local->isRep0Long[_maxPackSize_local->state] +
                                       uVar3,(uint)(UStack_40 != 1));
                  }
                  else {
                    UVar1 = _maxPackSize_local->reps[posState];
                    RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                       _maxPackSize_local->isRepG0 + _maxPackSize_local->state,1);
                    if (posState == 1) {
                      RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                         _maxPackSize_local->isRepG1 + _maxPackSize_local->state,0);
                    }
                    else {
                      RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                         _maxPackSize_local->isRepG1 + _maxPackSize_local->state,1);
                      RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                         _maxPackSize_local->isRepG2 + _maxPackSize_local->state,
                                         posState - 2);
                      if (posState == 3) {
                        _maxPackSize_local->reps[3] = _maxPackSize_local->reps[2];
                      }
                      _maxPackSize_local->reps[2] = _maxPackSize_local->reps[1];
                    }
                    _maxPackSize_local->reps[1] = _maxPackSize_local->reps[0];
                    _maxPackSize_local->reps[0] = UVar1;
                  }
                  if (UStack_40 == 1) {
                    _maxPackSize_local->state =
                         *(UInt32 *)(kShortRepNextStates + (ulong)_maxPackSize_local->state * 4);
                  }
                  else {
                    LenEnc_Encode2(&_maxPackSize_local->repLenEnc,&_maxPackSize_local->rc,
                                   UStack_40 - 2,uVar3,
                                   (uint)((_maxPackSize_local->fastMode != 0 ^ 0xffU) & 1),
                                   _maxPackSize_local->ProbPrices);
                    _maxPackSize_local->state =
                         *(UInt32 *)(kRepNextStates + (ulong)_maxPackSize_local->state * 4);
                  }
                }
                else {
                  RangeEnc_EncodeBit(&_maxPackSize_local->rc,
                                     _maxPackSize_local->isRep + _maxPackSize_local->state,0);
                  _maxPackSize_local->state =
                       *(UInt32 *)(kMatchNextStates + (ulong)_maxPackSize_local->state * 4);
                  LenEnc_Encode2(&_maxPackSize_local->lenEnc,&_maxPackSize_local->rc,UStack_40 - 2,
                                 uVar3,(uint)((_maxPackSize_local->fastMode != 0 ^ 0xffU) & 1),
                                 _maxPackSize_local->ProbPrices);
                  posState = posState - 4;
                  if (posState < 0x80) {
                    footerBits = (UInt32)_maxPackSize_local->g_FastPos[posState];
                  }
                  else {
                    iVar4 = ((int)(0x7ffff - posState) >> 0x1f & 0xcU) + 6;
                    footerBits = (uint)_maxPackSize_local->g_FastPos[posState >> (sbyte)iVar4] +
                                 iVar4 * 2;
                  }
                  if (UStack_40 < 5) {
                    local_8c = UStack_40 - 2;
                  }
                  else {
                    local_8c = 3;
                  }
                  RcTree_Encode(&_maxPackSize_local->rc,_maxPackSize_local->posSlotEncoder[local_8c]
                                ,6,footerBits);
                  if (3 < footerBits) {
                    iVar4 = (footerBits >> 1) - 1;
                    uVar3 = (footerBits & 1 | 2) << ((byte)iVar4 & 0x1f);
                    symbol = posState - uVar3;
                    if (footerBits < 0xe) {
                      RcTree_ReverseEncode
                                (&_maxPackSize_local->rc,
                                 (UInt16 *)
                                 ((long)_maxPackSize_local +
                                 (ulong)footerBits * -2 + (ulong)uVar3 * 2 + 0x34146),iVar4,symbol);
                    }
                    else {
                      RangeEnc_EncodeDirectBits
                                (&_maxPackSize_local->rc,symbol >> 4,(footerBits >> 1) - 5);
                      RcTree_ReverseEncode
                                (&_maxPackSize_local->rc,_maxPackSize_local->posAlignEncoder,4,
                                 symbol & 0xf);
                      _maxPackSize_local->alignPriceCount = _maxPackSize_local->alignPriceCount + 1;
                    }
                  }
                  _maxPackSize_local->reps[3] = _maxPackSize_local->reps[2];
                  _maxPackSize_local->reps[2] = _maxPackSize_local->reps[1];
                  _maxPackSize_local->reps[1] = _maxPackSize_local->reps[0];
                  _maxPackSize_local->reps[0] = posState;
                  _maxPackSize_local->matchPriceCount = _maxPackSize_local->matchPriceCount + 1;
                }
              }
              _maxPackSize_local->additionalOffset =
                   _maxPackSize_local->additionalOffset - UStack_40;
              __result__ = UStack_40 + __result__;
            } while (_maxPackSize_local->additionalOffset != 0);
            if (_maxPackSize_local->fastMode == 0) {
              if (0x7f < _maxPackSize_local->matchPriceCount) {
                FillDistancesPrices(_maxPackSize_local);
              }
              if (0xf < _maxPackSize_local->alignPriceCount) {
                FillAlignPrices(_maxPackSize_local);
              }
            }
            UVar1 = (*(_maxPackSize_local->matchFinder).GetNumAvailableBytes)
                              (_maxPackSize_local->matchFinderObj);
            if (UVar1 == 0) goto LAB_0020ea88;
            if (maxUnpackSize_local == 0) break;
            if ((startPos32 <= (__result__ - numPairs) + 0x112c) ||
               ((Byte *)(ulong)nowPos32 <=
                (_maxPackSize_local->rc).buf +
                (_maxPackSize_local->rc).cacheSize +
                ((_maxPackSize_local->rc).processed - (long)(_maxPackSize_local->rc).bufBase) +
                0x2000)) goto LAB_0020ea88;
          }
        } while (__result__ - numPairs < 0x8000);
        _maxPackSize_local->nowPos64 = (ulong)(__result__ - numPairs) + _maxPackSize_local->nowPos64
        ;
        p_local._4_4_ = CheckErrors(_maxPackSize_local);
      }
    }
  }
  else {
    p_local._4_4_ = _maxPackSize_local->result;
  }
  return p_local._4_4_;
}

Assistant:

static SRes LzmaEnc_CodeOneBlock(CLzmaEnc* p, Bool useLimits, UInt32 maxPackSize, UInt32 maxUnpackSize) {
  UInt32 nowPos32, startPos32;
  if (p->inStream != 0) {
    p->matchFinderBase.stream = p->inStream;
    p->matchFinder.Init(p->matchFinderObj);
    p->inStream = 0;
  }

  if (p->finished)
    return p->result;
  RINOK(CheckErrors(p));

  nowPos32 = (UInt32)p->nowPos64;
  startPos32 = nowPos32;

  if (p->nowPos64 == 0) {
    UInt32 numPairs;
    Byte curByte;
    if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
      return Flush(p, nowPos32);
    ReadMatchDistances(p, &numPairs);
    RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][0], 0);
    p->state = kLiteralNextStates[p->state];
    curByte = p->matchFinder.GetIndexByte(p->matchFinderObj, 0 - p->additionalOffset);
    LitEnc_Encode(&p->rc, p->litProbs, curByte);
    p->additionalOffset--;
    nowPos32++;
  }

  if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) != 0)
    for (;;) {
      UInt32 pos, len, posState;

      if (p->fastMode)
        len = GetOptimumFast(p, &pos);
      else
        len = GetOptimum(p, nowPos32, &pos);

#ifdef SHOW_STAT2
      printf("\n pos = %4X,   len = %d   pos = %d", nowPos32, len, pos);
#endif

      posState = nowPos32 & p->pbMask;
      if (len == 1 && pos == (UInt32)-1) {
        Byte curByte;
        CLzmaProb* probs;
        const Byte* data;

        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 0);
        data = p->matchFinder.GetPointerToCurrentPos(p->matchFinderObj) - p->additionalOffset;
        curByte = *data;
        probs = LIT_PROBS(nowPos32, *(data - 1));
        if (IsCharState(p->state))
          LitEnc_Encode(&p->rc, probs, curByte);
        else
          LitEnc_EncodeMatched(&p->rc, probs, curByte, *(data - p->reps[0] - 1));
        p->state = kLiteralNextStates[p->state];
      } else {
        RangeEnc_EncodeBit(&p->rc, &p->isMatch[p->state][posState], 1);
        if (pos < LZMA_NUM_REPS) {
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 1);
          if (pos == 0) {
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 0);
            RangeEnc_EncodeBit(&p->rc, &p->isRep0Long[p->state][posState], ((len == 1) ? 0 : 1));
          } else {
            UInt32 distance = p->reps[pos];
            RangeEnc_EncodeBit(&p->rc, &p->isRepG0[p->state], 1);
            if (pos == 1)
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 0);
            else {
              RangeEnc_EncodeBit(&p->rc, &p->isRepG1[p->state], 1);
              RangeEnc_EncodeBit(&p->rc, &p->isRepG2[p->state], pos - 2);
              if (pos == 3)
                p->reps[3] = p->reps[2];
              p->reps[2] = p->reps[1];
            }
            p->reps[1] = p->reps[0];
            p->reps[0] = distance;
          }
          if (len == 1)
            p->state = kShortRepNextStates[p->state];
          else {
            LenEnc_Encode2(&p->repLenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
            p->state = kRepNextStates[p->state];
          }
        } else {
          UInt32 posSlot;
          RangeEnc_EncodeBit(&p->rc, &p->isRep[p->state], 0);
          p->state = kMatchNextStates[p->state];
          LenEnc_Encode2(&p->lenEnc, &p->rc, len - LZMA_MATCH_LEN_MIN, posState, !p->fastMode, p->ProbPrices);
          pos -= LZMA_NUM_REPS;
          GetPosSlot(pos, posSlot);
          RcTree_Encode(&p->rc, p->posSlotEncoder[GetLenToPosState(len)], kNumPosSlotBits, posSlot);

          if (posSlot >= kStartPosModelIndex) {
            UInt32 footerBits = ((posSlot >> 1) - 1);
            UInt32 base = ((2 | (posSlot & 1)) << footerBits);
            UInt32 posReduced = pos - base;

            if (posSlot < kEndPosModelIndex)
              RcTree_ReverseEncode(&p->rc, p->posEncoders + base - posSlot - 1, footerBits, posReduced);
            else {
              RangeEnc_EncodeDirectBits(&p->rc, posReduced >> kNumAlignBits, footerBits - kNumAlignBits);
              RcTree_ReverseEncode(&p->rc, p->posAlignEncoder, kNumAlignBits, posReduced & kAlignMask);
              p->alignPriceCount++;
            }
          }
          p->reps[3] = p->reps[2];
          p->reps[2] = p->reps[1];
          p->reps[1] = p->reps[0];
          p->reps[0] = pos;
          p->matchPriceCount++;
        }
      }
      p->additionalOffset -= len;
      nowPos32 += len;
      if (p->additionalOffset == 0) {
        UInt32 processed;
        if (!p->fastMode) {
          if (p->matchPriceCount >= (1 << 7))
            FillDistancesPrices(p);
          if (p->alignPriceCount >= kAlignTableSize)
            FillAlignPrices(p);
        }
        if (p->matchFinder.GetNumAvailableBytes(p->matchFinderObj) == 0)
          break;
        processed = nowPos32 - startPos32;
        if (useLimits) {
          if (processed + kNumOpts + 300 >= maxUnpackSize ||
              RangeEnc_GetProcessed(&p->rc) + kNumOpts * 2 >= maxPackSize)
            break;
        } else if (processed >= (1 << 15)) {
          p->nowPos64 += nowPos32 - startPos32;
          return CheckErrors(p);
        }
      }
    }
  p->nowPos64 += nowPos32 - startPos32;
  return Flush(p, nowPos32);
}